

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

void double_conversion::CutToMaxSignificantDigits
               (Vector<const_char> buffer,int exponent,char *significant_buffer,
               int *significant_exponent)

{
  int iVar1;
  char *pcVar2;
  long in_RCX;
  int in_EDX;
  int *in_R8;
  int i;
  int local_2c;
  Vector<const_char> local_10;
  
  for (local_2c = 0; local_2c < 0x30b; local_2c = local_2c + 1) {
    pcVar2 = Vector<const_char>::operator[](&local_10,local_2c);
    *(char *)(in_RCX + local_2c) = *pcVar2;
  }
  *(undefined1 *)(in_RCX + 0x30b) = 0x31;
  iVar1 = Vector<const_char>::length(&local_10);
  *in_R8 = in_EDX + iVar1 + -0x30c;
  return;
}

Assistant:

static void CutToMaxSignificantDigits(Vector<const char> buffer,
                                       int exponent,
                                       char* significant_buffer,
                                       int* significant_exponent) {
  for (int i = 0; i < kMaxSignificantDecimalDigits - 1; ++i) {
    significant_buffer[i] = buffer[i];
  }
  // The input buffer has been trimmed. Therefore the last digit must be
  // different from '0'.
  DOUBLE_CONVERSION_ASSERT(buffer[buffer.length() - 1] != '0');
  // Set the last digit to be non-zero. This is sufficient to guarantee
  // correct rounding.
  significant_buffer[kMaxSignificantDecimalDigits - 1] = '1';
  *significant_exponent =
      exponent + (buffer.length() - kMaxSignificantDecimalDigits);
}